

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O2

FSerializer * Serialize(FSerializer *arc,char *key,subsector_t **ss,subsector_t **param_4)

{
  char cVar1;
  bool bVar2;
  ulong uVar3;
  FSerializer *pFVar4;
  long lVar5;
  long lVar6;
  int i;
  int iVar7;
  long lVar8;
  byte bVar9;
  byte bVar10;
  byte *pbVar11;
  char *str;
  int num_subs;
  TArray<char,_char> encoded;
  
  if (arc->w == (FWriter *)0x0) {
    bVar2 = FSerializer::BeginArray(arc,key);
    if (bVar2) {
      pFVar4 = FSerializer::operator()(arc,(char *)0x0,(int *)&encoded);
      pFVar4 = FSerializer::operator()(pFVar4,(char *)0x0,&num_subs);
      pFVar4 = FSerializer::StringPtr(pFVar4,(char *)0x0,&str);
      FSerializer::EndArray(pFVar4);
      bVar2 = hasglnodes;
      if ((((int)encoded.Array == numvertexes) && (num_subs == numsubsectors)) &&
         ((hasglnodes & 1U) != 0)) {
        lVar6 = 0x2c;
        iVar7 = 0;
        for (lVar8 = 0; cVar1 = str[lVar8], cVar1 != '\0'; lVar8 = lVar8 + 1) {
          bVar9 = cVar1 - 0x30;
          if (9 < bVar9) {
            if ((byte)(cVar1 + 0xbfU) < 0x1a) {
              bVar9 = cVar1 - 0x37;
            }
            else if ((byte)(cVar1 + 0x9fU) < 0x1a) {
              bVar9 = cVar1 - 0x3d;
            }
            else {
              bVar9 = 0x3e;
              if (cVar1 != '-') {
                if (cVar1 != '+') goto LAB_0043f3b4;
                bVar9 = 0x3f;
              }
            }
          }
          pbVar11 = (byte *)((long)&subsectors->sector + lVar6);
          for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
            if (((int)(iVar7 + (uint)lVar5) < numsubsectors) &&
               ((bVar9 >> ((uint)lVar5 & 0x1f) & 1) != 0)) {
              *pbVar11 = *pbVar11 | 2;
            }
            pbVar11 = pbVar11 + 0x30;
          }
          iVar7 = iVar7 + 6;
          lVar6 = lVar6 + 0x120;
        }
      }
      else {
LAB_0043f3b4:
        if ((bVar2 & 1U) != 0) {
          RecalculateDrawnSubsectors();
        }
      }
    }
  }
  else if (hasglnodes) {
    TArray<char,_char>::TArray(&encoded,(numsubsectors + 5) / 6 + 1);
    lVar6 = 0x2c;
    uVar3 = 0;
    for (lVar8 = 0; lVar8 < numsubsectors; lVar8 = lVar8 + 6) {
      pbVar11 = (byte *)((long)&subsectors->sector + lVar6);
      bVar9 = 0;
      for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
        if (((int)lVar8 + (int)lVar5 < numsubsectors) && ((*pbVar11 & 2) != 0)) {
          bVar9 = bVar9 | (byte)(1 << ((byte)lVar5 & 0x1f));
        }
        pbVar11 = pbVar11 + 0x30;
      }
      if (bVar9 < 10) {
        bVar10 = bVar9 | 0x30;
      }
      else if (bVar9 < 0x24) {
        bVar10 = bVar9 + 0x37;
      }
      else if (bVar9 < 0x3e) {
        bVar10 = bVar9 + 0x3d;
      }
      else {
        bVar10 = 0x2d;
        if ((bVar9 != 0x3e) && (bVar10 = bVar9, bVar9 == 0x3f)) {
          bVar10 = 0x2b;
        }
      }
      *(byte *)(CONCAT44(encoded.Array._4_4_,(int)encoded.Array) + uVar3) = bVar10;
      uVar3 = uVar3 + 1;
      lVar6 = lVar6 + 0x120;
    }
    *(undefined1 *)(CONCAT44(encoded.Array._4_4_,(int)encoded.Array) + (uVar3 & 0xffffffff)) = 0;
    bVar2 = FSerializer::BeginArray(arc,key);
    if (bVar2) {
      pFVar4 = FSerializer::operator()(arc,(char *)0x0,&numvertexes);
      pFVar4 = FSerializer::operator()(pFVar4,(char *)0x0,&numsubsectors);
      pFVar4 = FSerializer::StringPtr(pFVar4,(char *)0x0,&str);
      FSerializer::EndArray(pFVar4);
    }
    TArray<char,_char>::~TArray(&encoded);
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, subsector_t *&ss, subsector_t **)
{
	BYTE by;
	const char *str;

	if (arc.isWriting())
	{
		if (hasglnodes)
		{
			TArray<char> encoded(1 + (numsubsectors + 5) / 6);
			int p = 0;
			for (int i = 0; i < numsubsectors; i += 6)
			{
				by = 0;
				for (int j = 0; j < 6; j++)
				{
					if (i + j < numsubsectors && (subsectors[i + j].flags & SSECF_DRAWN))
					{
						by |= (1 << j);
					}
				}
				if (by < 10) by += '0';
				else if (by < 36) by += 'A' - 10;
				else if (by < 62) by += 'a' - 36;
				else if (by == 62) by = '-';
				else if (by == 63) by = '+';
				encoded[p++] = by;
			}
			encoded[p] = 0;
			str = &encoded[0];
			if (arc.BeginArray(key))
			{
				arc(nullptr, numvertexes)
					(nullptr, numsubsectors)
					.StringPtr(nullptr, str)
					.EndArray();
			}
		}
	}
	else
	{
		int num_verts, num_subs;
		bool success = false;
		if (arc.BeginArray(key))
		{
			arc(nullptr, num_verts)
				(nullptr, num_subs)
				.StringPtr(nullptr, str)
				.EndArray();

			if (num_verts == numvertexes && num_subs == numsubsectors && hasglnodes)
			{
				success = true;
				int sub = 0;
				for (int i = 0; str[i] != 0; i++)
				{
					by = str[i];
					if (by >= '0' && by <= '9') by -= '0';
					else if (by >= 'A' && by <= 'Z') by -= 'A' - 10;
					else if (by >= 'a' && by <= 'z') by -= 'a' - 36;
					else if (by == '-') by = 62;
					else if (by == '+') by = 63;
					else
					{
						success = false;
						break;
					}
					for (int s = 0; s < 6; s++)
					{
						if (sub + s < numsubsectors && (by & (1 << s)))
						{
							subsectors[sub + s].flags |= SSECF_DRAWN;
						}
					}
					sub += 6;
				}
			}
			if (hasglnodes && !success)
			{
				RecalculateDrawnSubsectors();
			}
		}

	}
	return arc;
}